

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

_Bool nni_aio_start(nni_aio *aio,nni_aio_cancel_fn cancel,void *data)

{
  nni_aio_expire_q *mtx;
  ulong uVar1;
  bool bVar2;
  nni_time nVar3;
  nng_err nVar4;
  _Bool timeout;
  nni_aio_expire_q *eq;
  void *data_local;
  nni_aio_cancel_fn cancel_local;
  nni_aio *aio_local;
  
  mtx = aio->a_expire_q;
  bVar2 = false;
  if (((aio->a_sleep & 1U) == 0) && ((aio->a_use_expire & 1U) == 0)) {
    if (aio->a_timeout + 2U < 2) {
      aio->a_expire = 0xffffffffffffffff;
    }
    else if (aio->a_timeout == 0) {
      bVar2 = true;
    }
    else {
      nVar3 = nni_clock();
      aio->a_expire = nVar3 + (long)aio->a_timeout;
    }
  }
  else if (((aio->a_use_expire & 1U) != 0) &&
          (uVar1 = aio->a_expire, nVar3 = nni_clock(), uVar1 <= nVar3)) {
    bVar2 = true;
  }
  if ((aio->a_sleep & 1U) == 0) {
    aio->a_expire_ok = false;
  }
  aio->a_result = NNG_OK;
  nni_task_prep(&aio->a_task);
  nni_mtx_lock(&mtx->eq_mtx);
  if ((aio->a_stopped & 1U) != 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",0x176
              ,"!aio->a_stopped");
  }
  if (((aio->a_stop & 1U) == 0) && ((mtx->eq_stop & 1U) == 0)) {
    if ((aio->a_abort & 1U) == 0) {
      if (bVar2) {
        aio->a_sleep = false;
        nVar4 = NNG_ETIMEDOUT;
        if ((aio->a_expire_ok & 1U) != 0) {
          nVar4 = NNG_OK;
        }
        aio->a_result = nVar4;
        aio->a_expire_ok = false;
        aio->a_count = 0;
        nni_mtx_unlock(&mtx->eq_mtx);
        nni_task_dispatch(&aio->a_task);
        aio_local._7_1_ = false;
      }
      else {
        if (aio->a_cancel_fn != (nni_aio_cancel_fn)0x0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c"
                    ,0x196,"aio->a_cancel_fn == NULL");
        }
        aio->a_cancel_fn = cancel;
        aio->a_cancel_arg = data;
        if ((aio->a_expire != 0xffffffffffffffff) && (cancel != (nni_aio_cancel_fn)0x0)) {
          nni_aio_expire_add(aio);
        }
        nni_mtx_unlock(&mtx->eq_mtx);
        aio_local._7_1_ = true;
      }
    }
    else {
      aio->a_sleep = false;
      aio->a_abort = false;
      aio->a_expire_ok = false;
      aio->a_count = 0;
      if (aio->a_result == NNG_OK) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                  0x187,"aio->a_result != NNG_OK");
      }
      nni_mtx_unlock(&mtx->eq_mtx);
      nni_task_dispatch(&aio->a_task);
      aio_local._7_1_ = false;
    }
  }
  else {
    aio->a_stop = true;
    aio->a_sleep = false;
    aio->a_expire_ok = false;
    aio->a_count = 0;
    aio->a_result = NNG_ESTOPPED;
    aio->a_stopped = true;
    nni_mtx_unlock(&mtx->eq_mtx);
    nni_task_dispatch(&aio->a_task);
    aio_local._7_1_ = false;
  }
  return aio_local._7_1_;
}

Assistant:

bool
nni_aio_start(nni_aio *aio, nni_aio_cancel_fn cancel, void *data)
{
	nni_aio_expire_q *eq      = aio->a_expire_q;
	bool              timeout = false;

	if (!aio->a_sleep && !aio->a_use_expire) {
		// Convert the relative timeout to an absolute timeout.
		switch (aio->a_timeout) {
		case NNG_DURATION_ZERO:
			timeout = true;
			break;
		case NNG_DURATION_INFINITE:
		case NNG_DURATION_DEFAULT:
			aio->a_expire = NNI_TIME_NEVER;
			break;
		default:
			aio->a_expire = nni_clock() + aio->a_timeout;
			break;
		}
	} else if (aio->a_use_expire && aio->a_expire <= nni_clock()) {
		timeout = true;
	}
	if (!aio->a_sleep) {
		aio->a_expire_ok = false;
	}
	aio->a_result = NNG_OK;

	// Do this outside the lock.  Note that we don't strictly need to have
	// done this for the failure cases below (the task framework does the
	// right thing if the task isn't prepped), but those should be uncommon
	// cases and doing this here avoids nesting the locks.
	nni_task_prep(&aio->a_task);

	nni_mtx_lock(&eq->eq_mtx);
	NNI_ASSERT(!aio->a_stopped);
	if (aio->a_stop || eq->eq_stop) {
		aio->a_stop      = true;
		aio->a_sleep     = false;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		aio->a_result    = NNG_ESTOPPED;
		aio->a_stopped   = true;
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}
	if (aio->a_abort) {
		aio->a_sleep     = false;
		aio->a_abort     = false;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		NNI_ASSERT(aio->a_result != NNG_OK);
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}
	if (timeout) {
		aio->a_sleep     = false;
		aio->a_result    = aio->a_expire_ok ? NNG_OK : NNG_ETIMEDOUT;
		aio->a_expire_ok = false;
		aio->a_count     = 0;
		nni_mtx_unlock(&eq->eq_mtx);
		nni_task_dispatch(&aio->a_task);
		return (false);
	}

	NNI_ASSERT(aio->a_cancel_fn == NULL);
	aio->a_cancel_fn  = cancel;
	aio->a_cancel_arg = data;

	// We only schedule expiration if we have a way for the expiration
	// handler to actively cancel it.
	if ((aio->a_expire != NNI_TIME_NEVER) && (cancel != NULL)) {
		nni_aio_expire_add(aio);
	}
	nni_mtx_unlock(&eq->eq_mtx);
	return (true);
}